

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int RunPLC(undefined8 param_1,undefined4 param_2,undefined8 param_3,Commandline *param_4)

{
  int iVar1;
  ostream *poVar2;
  allocator local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> command;
  string local_208;
  SymbolAccess device;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  
  bhf::ads::SymbolAccess::SymbolAccess(&device,param_3,param_1,param_2);
  std::__cxx11::string::string((string *)&name,"plc command is missing",(allocator *)&value);
  bhf::Commandline::Pop<std::__cxx11::string>(&command,param_4,&name);
  std::__cxx11::string::~string((string *)&name);
  iVar1 = std::__cxx11::string::compare((char *)&command);
  if (iVar1 == 0) {
    std::__cxx11::string::string
              ((string *)&value,"Variable name is missing",(allocator *)&local_208);
    bhf::Commandline::Pop<std::__cxx11::string>(&name,param_4,&value);
    std::__cxx11::string::~string((string *)&value);
    iVar1 = bhf::ads::SymbolAccess::Read((string *)&device,(ostream *)&name);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&command);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&command);
      if (iVar1 == 0) {
        iVar1 = bhf::ads::SymbolAccess::ShowSymbols((ostream *)&device);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&name);
        poVar2 = std::operator<<((ostream *)name.field_2._M_local_buf,"RunPLC");
        poVar2 = std::operator<<(poVar2,"(): Unknown PLC command \'");
        poVar2 = std::operator<<(poVar2,(string *)&command);
        std::operator<<(poVar2,"\'\n");
        std::__cxx11::stringbuf::str();
        Logger::Log(3,(string *)&value);
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::stringstream::~stringstream((stringstream *)&name);
        iVar1 = -1;
      }
      goto LAB_001072ab;
    }
    std::__cxx11::string::string
              ((string *)&value,"Variable name is missing",(allocator *)&local_208);
    bhf::Commandline::Pop<std::__cxx11::string>(&name,param_4,&value);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::string((string *)&local_208,"Value is missing",&local_249);
    bhf::Commandline::Pop<std::__cxx11::string>(&value,param_4,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    iVar1 = bhf::ads::SymbolAccess::Write((string *)&device,(string *)&name);
    std::__cxx11::string::~string((string *)&value);
  }
  std::__cxx11::string::~string((string *)&name);
LAB_001072ab:
  std::__cxx11::string::~string((string *)&command);
  AdsDevice::~AdsDevice((AdsDevice *)&device);
  return iVar1;
}

Assistant:

int RunPLC(const AmsNetId netid, const uint16_t port, const std::string& gw, bhf::Commandline& args)
{
    auto device = bhf::ads::SymbolAccess{ gw, netid, port };
    const auto command = args.Pop<std::string>("plc command is missing");

    if (!command.compare("read-symbol")) {
        const auto name = args.Pop<std::string>("Variable name is missing");
        return device.Read(name, std::cout);
    } else if (!command.compare("write-symbol")) {
        const auto name = args.Pop<std::string>("Variable name is missing");
        const auto value = args.Pop<std::string>("Value is missing");
        return device.Write(name, value);
    } else if (!command.compare("show-symbols")) {
        return device.ShowSymbols(std::cout);
    }
    LOG_ERROR(__FUNCTION__ << "(): Unknown PLC command '" << command << "'\n");
    return -1;
}